

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall QDateTimeEdit::setCurrentSection(QDateTimeEdit *this,Section section)

{
  QDateTimeEditPrivate *this_00;
  QLineEdit *this_01;
  Section s;
  Section SVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((section != NoSection) &&
     (this_00 = *(QDateTimeEditPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8,
     ((this_00->sections).super_QFlagsStorageHelper<QDateTimeEdit::Section,_4>.
      super_QFlagsStorage<QDateTimeEdit::Section>.i & section) != NoSection)) {
    (**(code **)(*(long *)&(this_00->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
              (&local_50,this_00);
    QDateTimeEditPrivate::updateCache
              (this_00,&(this_00->super_QAbstractSpinBoxPrivate).value,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    iVar4 = (int)this_00 + 0x3d8;
    iVar2 = *(int *)&this_00->field_0x418;
    iVar3 = *(int *)&this_00->field_0x3e0 + 1;
    iVar5 = 0;
    do {
      if (iVar3 < iVar2) {
        do {
          s = QDateTimeParser::sectionType(iVar4);
          SVar1 = QDateTimeEditPrivate::convertToPublic(s);
          if (SVar1 == section) {
            this_01 = (this_00->super_QAbstractSpinBoxPrivate).edit;
            iVar2 = QDateTimeParser::sectionPos(iVar4);
            QLineEdit::setCursorPosition(this_01,iVar2);
            goto LAB_003eb77a;
          }
          iVar3 = iVar3 + 1;
        } while (iVar2 != iVar3);
      }
      iVar3 = 0;
      bVar6 = iVar5 == 0;
      iVar5 = iVar5 + 1;
    } while (bVar6);
  }
LAB_003eb77a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEdit::setCurrentSection(Section section)
{
    Q_D(QDateTimeEdit);
    if (section == NoSection || !(section & d->sections))
        return;

    d->updateCache(d->value, d->displayText());
    const int size = d->sectionNodes.size();
    int index = d->currentSectionIndex + 1;
    for (int i=0; i<2; ++i) {
        while (index < size) {
            if (QDateTimeEditPrivate::convertToPublic(d->sectionType(index)) == section) {
                d->edit->setCursorPosition(d->sectionPos(index));
                QDTEDEBUG << d->sectionPos(index);
                return;
            }
            ++index;
        }
        index = 0;
    }
}